

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_decoder.c
# Opt level: O3

lzma_ret lzma_block_header_decode(lzma_block *block,lzma_allocator *allocator,uint8_t *in)

{
  ulong uVar1;
  uint8_t *puVar2;
  byte bVar3;
  lzma_filter *plVar4;
  uint32_t uVar5;
  lzma_ret lVar6;
  lzma_vli lVar7;
  long lVar8;
  size_t size;
  size_t in_pos;
  size_t local_40;
  lzma_allocator *local_38;
  
  bVar3 = in[1];
  local_40 = 2;
  plVar4 = block->filters;
  lVar8 = 8;
  do {
    *(undefined8 *)((long)plVar4 + lVar8 + -8) = 0xffffffffffffffff;
    *(undefined8 *)((long)&plVar4->id + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x58);
  block->version = 0;
  lVar6 = LZMA_PROG_ERROR;
  if (((uint)*in * 4 + 4 == block->header_size) && (block->check < 0x10)) {
    size = (ulong)*in * 4;
    uVar5 = lzma_crc32(in,size,0);
    lVar6 = LZMA_DATA_ERROR;
    if (uVar5 == *(uint32_t *)(in + size)) {
      lVar6 = LZMA_OPTIONS_ERROR;
      if ((in[1] & 0x3c) == 0) {
        if ((in[1] & 0x40) == 0) {
          block->compressed_size = 0xffffffffffffffff;
        }
        else {
          lVar6 = lzma_vli_decode(&block->compressed_size,(size_t *)0x0,in,&local_40,size);
          if (lVar6 != LZMA_OK) {
            return lVar6;
          }
          lVar7 = lzma_block_unpadded_size(block);
          if (lVar7 == 0) {
            return LZMA_DATA_ERROR;
          }
        }
        if ((char)in[1] < '\0') {
          lVar6 = lzma_vli_decode(&block->uncompressed_size,(size_t *)0x0,in,&local_40,size);
          if (lVar6 != LZMA_OK) {
            return lVar6;
          }
        }
        else {
          block->uncompressed_size = 0xffffffffffffffff;
        }
        lVar8 = 0;
        local_38 = allocator;
        do {
          lVar6 = lzma_filter_flags_decode
                            ((lzma_filter *)((long)&block->filters->id + lVar8),local_38,in,
                             &local_40,size);
          if (lVar6 != LZMA_OK) goto LAB_00530b2e;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)((bVar3 & 3) << 4) + 0x10 != lVar8);
        do {
          if (size <= local_40) {
            return LZMA_OK;
          }
          uVar1 = local_40 + 1;
          puVar2 = in + local_40;
          local_40 = uVar1;
        } while (*puVar2 == '\0');
        lVar6 = LZMA_OPTIONS_ERROR;
LAB_00530b2e:
        free_properties(block,local_38);
      }
    }
  }
  return lVar6;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_decode(lzma_block *block,
		lzma_allocator *allocator, const uint8_t *in)
{
	const size_t filter_count = (in[1] & 3) + 1;
	size_t in_size;
	size_t i;

	// Start after the Block Header Size and Block Flags fields.
	size_t in_pos = 2;

	// NOTE: We consider the header to be corrupt not only when the
	// CRC32 doesn't match, but also when variable-length integers
	// are invalid or over 63 bits, or if the header is too small
	// to contain the claimed information.

	// Initialize the filter options array. This way the caller can
	// safely free() the options even if an error occurs in this function.
	for (i = 0; i <= LZMA_FILTERS_MAX; ++i) {
		block->filters[i].id = LZMA_VLI_UNKNOWN;
		block->filters[i].options = NULL;
	}

	// Always zero for now.
	block->version = 0;

	// Validate Block Header Size and Check type. The caller must have
	// already set these, so it is a programming error if this test fails.
	if (lzma_block_header_size_decode(in[0]) != block->header_size
			|| (unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	// Exclude the CRC32 field.
	in_size = block->header_size - 4;

	// Verify CRC32
	if (lzma_crc32(in, in_size, 0) != unaligned_read32le(in + in_size))
		return LZMA_DATA_ERROR;

	// Check for unsupported flags.
	if (in[1] & 0x3C)
		return LZMA_OPTIONS_ERROR;

	// Compressed Size
	if (in[1] & 0x40) {
		return_if_error(lzma_vli_decode(&block->compressed_size,
				NULL, in, &in_pos, in_size));

		// Validate Compressed Size. This checks that it isn't zero
		// and that the total size of the Block is a valid VLI.
		if (lzma_block_unpadded_size(block) == 0)
			return LZMA_DATA_ERROR;
	} else {
		block->compressed_size = LZMA_VLI_UNKNOWN;
	}

	// Uncompressed Size
	if (in[1] & 0x80)
		return_if_error(lzma_vli_decode(&block->uncompressed_size,
				NULL, in, &in_pos, in_size));
	else
		block->uncompressed_size = LZMA_VLI_UNKNOWN;

	// Filter Flags
	for (i = 0; i < filter_count; ++i) {
		const lzma_ret ret = lzma_filter_flags_decode(
				&block->filters[i], allocator,
				in, &in_pos, in_size);
		if (ret != LZMA_OK) {
			free_properties(block, allocator);
			return ret;
		}
	}

	// Padding
	while (in_pos < in_size) {
		if (in[in_pos++] != 0x00) {
			free_properties(block, allocator);

			// Possibly some new field present so use
			// LZMA_OPTIONS_ERROR instead of LZMA_DATA_ERROR.
			return LZMA_OPTIONS_ERROR;
		}
	}

	return LZMA_OK;
}